

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::ForNode::ForNode
          (ForNode *this,Location *loc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *var_names,shared_ptr<minja::Expression> *iterable,
          shared_ptr<minja::Expression> *condition,shared_ptr<minja::TemplateNode> *body,
          bool recursive,shared_ptr<minja::TemplateNode> *else_body)

{
  TemplateNode *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  byte in_stack_00000008;
  Location *in_stack_ffffffffffffffa8;
  TemplateNode *__x;
  
  __x = in_RDI;
  TemplateNode::TemplateNode(in_RDI,in_stack_ffffffffffffffa8);
  in_RDI->_vptr_TemplateNode = (_func_int **)&PTR_do_render_0042a4c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(unaff_retaddr,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__x);
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RDI,
             (shared_ptr<minja::Expression> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RDI,
             (shared_ptr<minja::Expression> *)in_stack_ffffffffffffffa8);
  std::shared_ptr<minja::TemplateNode>::shared_ptr
            ((shared_ptr<minja::TemplateNode> *)in_RDI,
             (shared_ptr<minja::TemplateNode> *)in_stack_ffffffffffffffa8);
  *(byte *)&in_RDI[3].location_.source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = in_stack_00000008 & 1;
  std::shared_ptr<minja::TemplateNode>::shared_ptr
            ((shared_ptr<minja::TemplateNode> *)in_RDI,
             (shared_ptr<minja::TemplateNode> *)in_stack_ffffffffffffffa8);
  return;
}

Assistant:

ForNode(const Location & loc, std::vector<std::string> && var_names, std::shared_ptr<Expression> && iterable,
      std::shared_ptr<Expression> && condition, std::shared_ptr<TemplateNode> && body, bool recursive, std::shared_ptr<TemplateNode> && else_body)
            : TemplateNode(loc), var_names(var_names), iterable(std::move(iterable)), condition(std::move(condition)), body(std::move(body)), recursive(recursive), else_body(std::move(else_body)) {}